

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O2

SUNErrCode
SUNLinSolSetPreconditioner_SPBCGS
          (SUNLinearSolver S,void *PData,SUNPSetupFn Psetup,SUNPSolveFn Psolve)

{
  void *pvVar1;
  
  pvVar1 = S->content;
  *(SUNPSetupFn *)((long)pvVar1 + 0x30) = Psetup;
  *(SUNPSolveFn *)((long)pvVar1 + 0x38) = Psolve;
  *(void **)((long)pvVar1 + 0x40) = PData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetPreconditioner_SPBCGS(SUNLinearSolver S, void* PData,
                                             SUNPSetupFn Psetup,
                                             SUNPSolveFn Psolve)
{
  SUNFunctionBegin(S->sunctx);
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  SPBCGS_CONTENT(S)->Psetup = Psetup;
  SPBCGS_CONTENT(S)->Psolve = Psolve;
  SPBCGS_CONTENT(S)->PData  = PData;
  return SUN_SUCCESS;
}